

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixAccess(sqlite3_vfs *NotUsed,char *zPath,int flags,int *pResOut)

{
  int iVar1;
  uint uVar2;
  stat buf;
  undefined1 auStack_98 [24];
  uint local_80;
  long local_68;
  
  if (flags == 0) {
    iVar1 = (*aSyscall[4].pCurrent)(zPath,auStack_98);
    uVar2 = 0;
    if (iVar1 == 0) {
      uVar2 = (uint)(0 < local_68 || (local_80 & 0xf000) != 0x8000);
    }
  }
  else {
    iVar1 = (*aSyscall[2].pCurrent)(zPath,6);
    uVar2 = (uint)(iVar1 == 0);
  }
  *pResOut = uVar2;
  return 0;
}

Assistant:

static int unixAccess(
  sqlite3_vfs *NotUsed,   /* The VFS containing this xAccess method */
  const char *zPath,      /* Path of the file to examine */
  int flags,              /* What do we want to learn about the zPath file? */
  int *pResOut            /* Write result boolean here */
){
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError( return SQLITE_IOERR_ACCESS; );
  assert( pResOut!=0 );

  /* The spec says there are three possible values for flags.  But only
  ** two of them are actually used */
  assert( flags==SQLITE_ACCESS_EXISTS || flags==SQLITE_ACCESS_READWRITE );

  if( flags==SQLITE_ACCESS_EXISTS ){
    struct stat buf;
    *pResOut = 0==osStat(zPath, &buf) &&
                (!S_ISREG(buf.st_mode) || buf.st_size>0);
  }else{
    *pResOut = osAccess(zPath, W_OK|R_OK)==0;
  }
  return SQLITE_OK;
}